

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

void Ses_ManPrintRuntime(Ses_Man_t *pSes)

{
  double local_70;
  double local_60;
  double local_50;
  double local_40;
  double local_30;
  double local_20;
  Ses_Man_t *pSes_local;
  
  printf("Runtime breakdown:\n");
  Abc_Print(1,"%s =","Sat     ");
  if (((double)pSes->timeTotal != 0.0) || (NAN((double)pSes->timeTotal))) {
    local_20 = ((double)pSes->timeSat * 100.0) / (double)pSes->timeTotal;
  }
  else {
    local_20 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)pSes->timeSat * 1.0) / 1000000.0,local_20);
  Abc_Print(1,"%s ="," Sat    ");
  if (((double)pSes->timeTotal != 0.0) || (NAN((double)pSes->timeTotal))) {
    local_30 = ((double)pSes->timeSatSat * 100.0) / (double)pSes->timeTotal;
  }
  else {
    local_30 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)pSes->timeSatSat * 1.0) / 1000000.0,local_30);
  Abc_Print(1,"%s ="," Unsat  ");
  if (((double)pSes->timeTotal != 0.0) || (NAN((double)pSes->timeTotal))) {
    local_40 = ((double)pSes->timeSatUnsat * 100.0) / (double)pSes->timeTotal;
  }
  else {
    local_40 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)pSes->timeSatUnsat * 1.0) / 1000000.0,local_40);
  Abc_Print(1,"%s ="," Undef  ");
  if (((double)pSes->timeTotal != 0.0) || (NAN((double)pSes->timeTotal))) {
    local_50 = ((double)pSes->timeSatUndef * 100.0) / (double)pSes->timeTotal;
  }
  else {
    local_50 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)pSes->timeSatUndef * 1.0) / 1000000.0,local_50);
  Abc_Print(1,"%s =","Instance");
  if (((double)pSes->timeTotal != 0.0) || (NAN((double)pSes->timeTotal))) {
    local_60 = ((double)pSes->timeInstance * 100.0) / (double)pSes->timeTotal;
  }
  else {
    local_60 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)pSes->timeInstance * 1.0) / 1000000.0,local_60);
  Abc_Print(1,"%s =","ALL     ");
  if (((double)pSes->timeTotal != 0.0) || (NAN((double)pSes->timeTotal))) {
    local_70 = ((double)pSes->timeTotal * 100.0) / (double)pSes->timeTotal;
  }
  else {
    local_70 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)pSes->timeTotal * 1.0) / 1000000.0,local_70);
  return;
}

Assistant:

static void Ses_ManPrintRuntime( Ses_Man_t * pSes )
{
    printf( "Runtime breakdown:\n" );
    ABC_PRTP( "Sat     ",  pSes->timeSat,      pSes->timeTotal );
    ABC_PRTP( " Sat    ",  pSes->timeSatSat,   pSes->timeTotal );
    ABC_PRTP( " Unsat  ",  pSes->timeSatUnsat, pSes->timeTotal );
    ABC_PRTP( " Undef  ",  pSes->timeSatUndef, pSes->timeTotal );
    ABC_PRTP( "Instance", pSes->timeInstance,  pSes->timeTotal );
    ABC_PRTP( "ALL     ",  pSes->timeTotal,    pSes->timeTotal );
}